

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

Box<Dims> * adios2::helper::StartCountBox(Dims *start,Dims *end)

{
  size_type __n;
  const_reference pvVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Box<Dims> *in_RDI;
  size_t d;
  size_t size;
  Box<Dims> *box;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffffb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong local_30;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (in_stack_ffffffffffffffb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&box->first,start);
  __n = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffe0),__n);
  for (local_30 = 0; local_30 < __n; local_30 = local_30 + 1) {
    __x = &in_RDI->second;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_30)
    ;
    this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,(value_type *)__x);
  }
  return in_RDI;
}

Assistant:

Box<Dims> StartCountBox(const Dims &start, const Dims &end) noexcept
{
    Box<Dims> box;
    box.first = start;
    const size_t size = start.size();
    box.second.reserve(size);

    for (size_t d = 0; d < size; ++d)
    {
        box.second.push_back(end[d] - start[d] + 1); // end inclusive
    }

    return box;
}